

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void zcr_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  int el;
  uint32_t uVar1;
  uint32_t uVar2;
  
  el = arm_current_el(env);
  uVar1 = sve_zcr_len_for_el_aarch64(env,el);
  raw_write(env,ri,(ulong)((uint)value & 0xf));
  uVar2 = sve_zcr_len_for_el_aarch64(env,el);
  if (uVar2 < uVar1) {
    aarch64_sve_narrow_vq_aarch64(env,uVar2 + 1);
    return;
  }
  return;
}

Assistant:

static void zcr_write(CPUARMState *env, const ARMCPRegInfo *ri,
                      uint64_t value)
{
    int cur_el = arm_current_el(env);
    int old_len = sve_zcr_len_for_el(env, cur_el);
    int new_len;

    /* Bits other than [3:0] are RAZ/WI.  */
    QEMU_BUILD_BUG_ON(ARM_MAX_VQ > 16);
    raw_write(env, ri, value & 0xf);

    /*
     * Because we arrived here, we know both FP and SVE are enabled;
     * otherwise we would have trapped access to the ZCR_ELn register.
     */
    new_len = sve_zcr_len_for_el(env, cur_el);
    if (new_len < old_len) {
        aarch64_sve_narrow_vq(env, new_len + 1);
    }
}